

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KCPServer.cpp
# Opt level: O2

void __thiscall net_uv::KCPServer::executeOperation(KCPServer *this)

{
  Mutex *mutex;
  queue<net_uv::SessionManager::SessionOperation,_std::deque<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  map<unsigned_int,_net_uv::KCPServer::serverSessionData,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_net_uv::KCPServer::serverSessionData>_>_>
  *this_01;
  _Elt_pointer pSVar2;
  int iVar3;
  value_type *pvVar4;
  _Base_ptr p_Var5;
  iterator iVar6;
  value_type *__x;
  
  mutex = &(this->super_Server).super_SessionManager.m_operationMutex;
  iVar3 = uv_mutex_trylock(&mutex->m_uv_mutext);
  if (iVar3 == 0) {
    __x = (this->super_Server).super_SessionManager.m_operationQue.c.
          super__Deque_base<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>
          ._M_impl.super__Deque_impl_data._M_start._M_cur;
    pvVar4 = (this->super_Server).super_SessionManager.m_operationQue.c.
             super__Deque_base<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pvVar4 == __x) {
      uv_mutex_unlock(&mutex->m_uv_mutext);
      return;
    }
    this_00 = &(this->super_Server).super_SessionManager.m_operationDispatchQue;
    while (pvVar4 != __x) {
      std::
      deque<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>
      ::push_back(&this_00->c,__x);
      std::
      deque<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>
      ::pop_front(&(this->super_Server).super_SessionManager.m_operationQue.c);
      __x = (this->super_Server).super_SessionManager.m_operationQue.c.
            super__Deque_base<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
      pvVar4 = (this->super_Server).super_SessionManager.m_operationQue.c.
               super__Deque_base<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    }
    uv_mutex_unlock(&mutex->m_uv_mutext);
    p_Var1 = &(this->m_allSession)._M_t._M_impl.super__Rb_tree_header;
    this_01 = &this->m_allSession;
    while (pSVar2 = (this->super_Server).super_SessionManager.m_operationDispatchQue.c.
                    super__Deque_base<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur,
          (this->super_Server).super_SessionManager.m_operationDispatchQue.c.
          super__Deque_base<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur != pSVar2) {
      switch(pSVar2->operationType) {
      case 0:
        for (p_Var5 = (this->m_allSession)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var5 != p_Var1; p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)
            ) {
          if (*(char *)&p_Var5[1]._M_left == '\0') {
            (**(code **)(*(long *)p_Var5[1]._M_parent + 0x48))();
          }
        }
        (*(this->m_server->super_Socket)._vptr_Socket[7])();
        (this->super_Server).m_serverStage = WAIT_CLOSE_SERVER_SOCKET;
        Runnable::stopTimerUpdate((Runnable *)this);
        break;
      case 1:
        iVar6 = std::
                _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_net_uv::KCPServer::serverSessionData>,_std::_Select1st<std::pair<const_unsigned_int,_net_uv::KCPServer::serverSessionData>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_net_uv::KCPServer::serverSessionData>_>_>
                ::find(&this_01->_M_t,&pSVar2->sessionID);
        if ((_Rb_tree_header *)iVar6._M_node == p_Var1) {
LAB_0014e594:
          free(pSVar2->operationData);
        }
        else {
          (**(code **)(*(long *)iVar6._M_node[1]._M_parent + 0x38))
                    (iVar6._M_node[1]._M_parent,pSVar2->operationData,pSVar2->operationDataLen);
        }
        break;
      case 2:
        iVar6 = std::
                _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_net_uv::KCPServer::serverSessionData>,_std::_Select1st<std::pair<const_unsigned_int,_net_uv::KCPServer::serverSessionData>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_net_uv::KCPServer::serverSessionData>_>_>
                ::find(&this_01->_M_t,&pSVar2->sessionID);
        if ((_Rb_tree_header *)iVar6._M_node == p_Var1) goto LAB_0014e594;
        (**(code **)(*(long *)iVar6._M_node[1]._M_parent + 0x40))
                  (iVar6._M_node[1]._M_parent,pSVar2->operationData,pSVar2->operationDataLen);
        break;
      case 3:
        iVar6 = std::
                _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_net_uv::KCPServer::serverSessionData>,_std::_Select1st<std::pair<const_unsigned_int,_net_uv::KCPServer::serverSessionData>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_net_uv::KCPServer::serverSessionData>_>_>
                ::find(&this_01->_M_t,&pSVar2->sessionID);
        if ((_Rb_tree_header *)iVar6._M_node != p_Var1) {
          (**(code **)(*(long *)iVar6._M_node[1]._M_parent + 0x48))();
        }
        break;
      case 4:
        iVar6 = std::
                _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_net_uv::KCPServer::serverSessionData>,_std::_Select1st<std::pair<const_unsigned_int,_net_uv::KCPServer::serverSessionData>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_net_uv::KCPServer::serverSessionData>_>_>
                ::find(&this_01->_M_t,&pSVar2->sessionID);
        if ((_Rb_tree_header *)iVar6._M_node != p_Var1) {
          (*(code *)**(undefined8 **)iVar6._M_node[1]._M_parent)();
          free(iVar6._M_node[1]._M_parent);
          std::
          _Rb_tree<unsigned_int,std::pair<unsigned_int_const,net_uv::KCPServer::serverSessionData>,std::_Select1st<std::pair<unsigned_int_const,net_uv::KCPServer::serverSessionData>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,net_uv::KCPServer::serverSessionData>>>
          ::erase_abi_cxx11_((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,net_uv::KCPServer::serverSessionData>,std::_Select1st<std::pair<unsigned_int_const,net_uv::KCPServer::serverSessionData>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,net_uv::KCPServer::serverSessionData>>>
                              *)this_01,iVar6);
        }
      }
      std::
      deque<net_uv::SessionManager::SessionOperation,_std::allocator<net_uv::SessionManager::SessionOperation>_>
      ::pop_front(&this_00->c);
    }
  }
  return;
}

Assistant:

void KCPServer::executeOperation()
{
	if (m_operationMutex.trylock() != 0)
	{
		return;
	}

	if (m_operationQue.empty())
	{
		m_operationMutex.unlock();
		return;
	}

	while (!m_operationQue.empty())
	{
		m_operationDispatchQue.push(m_operationQue.front());
		m_operationQue.pop();
	}
	m_operationMutex.unlock();

	while (!m_operationDispatchQue.empty())
	{
		auto & curOperation = m_operationDispatchQue.front();
		switch (curOperation.operationType)
		{
		case KCP_SVR_OP_SEND_DATA:
		{
			auto it = m_allSession.find(curOperation.sessionID);
			if (it != m_allSession.end())
			{
				it->second.session->executeSend((char*)curOperation.operationData, curOperation.operationDataLen);
			}
			else
			{
				//invalid session
				fc_free(curOperation.operationData);
			}
		}break;
		case KCP_SVR_OP_SEND_CLOSE:
		{
			auto it = m_allSession.find(curOperation.sessionID);
			if (it != m_allSession.end())
			{
				it->second.session->executeSendAndClose((char*)curOperation.operationData, curOperation.operationDataLen);
			}
			else
			{
				//invalid session
				fc_free(curOperation.operationData);
			}
		}break;
		case KCP_SVR_OP_DIS_SESSION:
		{
			auto it = m_allSession.find(curOperation.sessionID);
			if (it != m_allSession.end())
			{
				it->second.session->executeDisconnect();
			}
		}break;
		case KCP_SVR_OP_SEND_DIS_SESSION_MSG_TO_MAIN_THREAD:
		{
			auto it = m_allSession.find(curOperation.sessionID);
			if (it != m_allSession.end())
			{
				it->second.session->~KCPSession();
				fc_free(it->second.session);
				it = m_allSession.erase(it);
			}
		}break;
		case KCP_SVR_OP_STOP_SERVER:
		{
			for (auto & it : m_allSession)
			{
				if (!it.second.isInvalid)
				{
					it.second.session->executeDisconnect();
				}
			}
			m_server->disconnect();
			m_serverStage = ServerStage::WAIT_CLOSE_SERVER_SOCKET;

			stopTimerUpdate();
		}break;
		default:
			break;
		}
		m_operationDispatchQue.pop();
	}
}